

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::geometry::anon_unknown_0::GeometryOutputCountTest::createInstance
          (GeometryOutputCountTest *this,Context *context)

{
  GeometryOutputCountTestInstance *this_00;
  size_type sVar1;
  char *name;
  Context *context_local;
  GeometryOutputCountTest *this_local;
  
  this_00 = (GeometryOutputCountTestInstance *)operator_new(0x78);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->m_pattern);
  name = tcu::TestNode::getName((TestNode *)this);
  GeometryOutputCountTestInstance::GeometryOutputCountTestInstance
            (this_00,context,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,(int)sVar1,name);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* GeometryOutputCountTest::createInstance (Context& context) const
{
	return new GeometryOutputCountTestInstance (context, VK_PRIMITIVE_TOPOLOGY_POINT_LIST, static_cast<int>(m_pattern.size()), getName());
}